

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.cpp
# Opt level: O0

czstring pstore::http::opcode_name(opcode op)

{
  char *pcStack_10;
  opcode op_local;
  
  if (op == continuation) {
    pcStack_10 = "continuation";
  }
  else if (op == text) {
    pcStack_10 = "text";
  }
  else if (op == binary) {
    pcStack_10 = "binary";
  }
  else if (op == reserved_nc_1) {
    pcStack_10 = "reserved_nc_1";
  }
  else if (op == reserved_nc_2) {
    pcStack_10 = "reserved_nc_2";
  }
  else if (op == reserved_nc_3) {
    pcStack_10 = "reserved_nc_3";
  }
  else if (op == reserved_nc_4) {
    pcStack_10 = "reserved_nc_4";
  }
  else if (op == reserved_nc_5) {
    pcStack_10 = "reserved_nc_5";
  }
  else if (op == close) {
    pcStack_10 = "close";
  }
  else if (op == ping) {
    pcStack_10 = "ping";
  }
  else if (op == pong) {
    pcStack_10 = "pong";
  }
  else if (op == reserved_control_1) {
    pcStack_10 = "reserved_control_1";
  }
  else if (op == reserved_control_2) {
    pcStack_10 = "reserved_control_2";
  }
  else if (op == reserved_control_3) {
    pcStack_10 = "reserved_control_3";
  }
  else if (op == reserved_control_4) {
    pcStack_10 = "reserved_control_4";
  }
  else if (op == reserved_control_5) {
    pcStack_10 = "reserved_control_5";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

auto opcode_name (opcode const op) noexcept -> gsl::czstring {
            switch (op) {
            case opcode::continuation: return "continuation";
            case opcode::text: return "text";
            case opcode::binary: return "binary";
            case opcode::reserved_nc_1: return "reserved_nc_1";
            case opcode::reserved_nc_2: return "reserved_nc_2";
            case opcode::reserved_nc_3: return "reserved_nc_3";
            case opcode::reserved_nc_4: return "reserved_nc_4";
            case opcode::reserved_nc_5: return "reserved_nc_5";
            case opcode::close: return "close";
            case opcode::ping: return "ping";
            case opcode::pong: return "pong";
            case opcode::reserved_control_1: return "reserved_control_1";
            case opcode::reserved_control_2: return "reserved_control_2";
            case opcode::reserved_control_3: return "reserved_control_3";
            case opcode::reserved_control_4: return "reserved_control_4";
            case opcode::reserved_control_5: return "reserved_control_5";
            case opcode::unknown: break;
            }
            return "unknown";
        }